

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

bool __thiscall
ON_String::Equal(ON_String *this,char *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int element_count1;
  char *string1;
  
  string1 = operator_cast_to_char_(this);
  element_count1 = Length(this);
  ON_Locale::IsOrdinal(locale);
  bVar1 = EqualOrdinal(string1,element_count1,other_string,-1,bIgnoreCase);
  return bVar1;
}

Assistant:

bool ON_String::Equal(
  const char* other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_String::Equal(
    static_cast<const char*>(*this),
    this->Length(),
    other_string,
    -1,
    locale,
    bIgnoreCase );
}